

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createMatrixConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  bool bVar3;
  Id IVar4;
  uint uVar5;
  uint uVar6;
  Id IVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  pointer *ppuVar12;
  Id *pIVar13;
  long lVar14;
  uint uVar15;
  uint col_1;
  ulong uVar16;
  long lVar17;
  Id IVar18;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar19;
  Decoration DVar20;
  pointer *__x;
  Id matrix;
  ulong uVar21;
  Id column;
  Id colv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matrixColumns;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Id ids [4] [4];
  uint local_e4;
  uint local_e0;
  Id local_dc;
  Id local_d8;
  Decoration local_d4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d0;
  Id local_c4;
  ulong local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  Id local_9c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  ulong local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78 [3];
  
  IVar4 = getScalarTypeId(this,resultTypeId);
  uVar5 = getTypeNumColumns(this,resultTypeId);
  local_d8 = resultTypeId;
  local_e0 = getTypeNumRows(this,resultTypeId);
  uVar15 = 0;
  local_dc = IVar4;
  uVar6 = Instruction::getImmediateOperand
                    ((this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[IVar4],0);
  puVar11 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[*puVar11];
  if (pIVar2 != (Instruction *)0x0) {
    uVar15 = pIVar2->typeId;
  }
  local_d4 = precision;
  local_d0 = sources;
  if (ppIVar1[uVar15]->opCode == OpTypeMatrix) {
    uVar15 = getNumColumns(this,*puVar11);
    puVar11 = (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (uVar5 <= uVar15) {
      uVar15 = getNumRows(this,*puVar11);
      puVar11 = (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (local_e0 <= uVar15) {
        uVar15 = *puVar11;
        local_dc = getContainedTypeId(this,local_d8);
        pIVar2 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar15];
        uVar6 = 0;
        IVar4 = 0;
        if (pIVar2 != (Instruction *)0x0) {
          IVar4 = pIVar2->typeId;
        }
        IVar4 = getContainedTypeId(this,IVar4);
        local_78[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          DVar20 = local_d4;
          IVar7 = local_dc;
          local_b8._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_b8._M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
          if (local_e0 <= uVar6) break;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                     (value_type_conflict1 *)&local_b8);
          uVar6 = (int)local_b8._M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (local_e4 = 0; local_e4 < uVar5; local_e4 = local_e4 + 1) {
          local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,&local_e4);
          local_c4 = createCompositeExtract
                               (this,uVar15,IVar4,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
          setPrecision(this,local_c4,DVar20);
          uVar6 = getNumRows(this,uVar15);
          if (local_e0 == uVar6) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,&local_c4);
          }
          else {
            local_9c = createRvalueSwizzle(this,DVar20,IVar7,local_c4,
                                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           local_78);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,&local_9c);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
        }
        IVar4 = createCompositeConstruct
                          (this,local_d8,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
        IVar4 = setPrecision(this,IVar4,local_d4);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b8);
        this_00 = local_78;
        goto LAB_003d942e;
      }
    }
  }
  local_80 = (ulong)uVar5;
  if ((long)(local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar11 >> 2 == local_80) {
    ppIVar1 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = ppIVar1[*puVar11];
    if (pIVar2 == (Instruction *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (ulong)pIVar2->typeId;
    }
    if (((ppIVar1[uVar16]->opCode == OpTypeVector) &&
        (uVar15 = getNumComponents(this,*puVar11), uVar15 == local_e0)) &&
       (puVar11 = (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start,
       bVar3 = std::__equal<true>::equal<unsigned_int>
                         ((__equal<true> *)(puVar11 + 1),
                          (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_finish,puVar11,(uint *)local_d0),
       bVar3)) {
      IVar4 = createCompositeConstruct(this,local_d8,local_d0);
      IVar4 = setPrecision(this,IVar4,precision);
      return IVar4;
    }
  }
  if (uVar6 == 0x40) {
    IVar4 = makeDoubleConstant(this,1.0,false);
    IVar7 = makeDoubleConstant(this,0.0,false);
  }
  else {
    IVar4 = makeFloatConstant(this,1.0,false);
    IVar7 = makeFloatConstant(this,0.0,false);
  }
  ppuVar12 = (pointer *)local_78;
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      IVar18 = IVar7;
      if (lVar14 == lVar17) {
        IVar18 = IVar4;
      }
      *(Id *)((long)ppuVar12 + lVar17 * 4) = IVar18;
    }
    ppuVar12 = ppuVar12 + 2;
  }
  pIVar13 = (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pIVar13 == 4) {
    bVar3 = isScalar(this,*pIVar13);
    pIVar13 = (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (!bVar3) goto LAB_003d917f;
    for (lVar14 = 0; lVar14 != 0x50; lVar14 = lVar14 + 0x14) {
      *(Id *)((long)&local_78[0]._M_impl.super__Vector_impl_data._M_start + lVar14) = *pIVar13;
    }
  }
  else {
LAB_003d917f:
    uVar15 = *pIVar13;
    ppIVar1 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = ppIVar1[uVar15];
    if (pIVar2 == (Instruction *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (ulong)pIVar2->typeId;
    }
    if (ppIVar1[uVar16]->opCode == OpTypeMatrix) {
      uVar6 = getNumColumns(this,uVar15);
      if (uVar6 < uVar5) {
        uVar5 = uVar6;
      }
      uVar6 = getNumRows(this,uVar15);
      if (local_e0 <= uVar6) {
        uVar6 = local_e0;
      }
      uVar8 = 0;
      while( true ) {
        local_98._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_98._M_impl.super__Vector_impl_data._M_start._4_4_,uVar8);
        if (uVar5 <= uVar8) break;
        local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
                   (value_type_conflict1 *)&local_98);
        for (local_e4 = 0; local_e4 < uVar6; local_e4 = local_e4 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,&local_e4);
          IVar4 = createCompositeExtract
                            (this,uVar15,local_dc,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
          *(Id *)((long)&local_78[0]._M_impl.super__Vector_impl_data._M_start +
                 (ulong)local_e4 * 4 +
                 ((ulong)local_98._M_impl.super__Vector_impl_data._M_start & 0xffffffff) * 0x10) =
               IVar4;
          local_b8._M_impl.super__Vector_impl_data._M_finish =
               local_b8._M_impl.super__Vector_impl_data._M_finish + -1;
          setPrecision(this,IVar4,precision);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b8);
        uVar8 = (int)local_98._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    else {
      uVar16 = 0;
      uVar15 = 0;
      uVar6 = 0;
      pvVar19 = local_d0;
      while ((uVar21 = (ulong)uVar6,
             uVar21 < (ulong)((long)(pvVar19->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar13 >> 2)
             && (uVar15 < uVar5))) {
        local_c0 = CONCAT44(local_c0._4_4_,pIVar13[uVar21]);
        uVar8 = 0;
        do {
          uVar9 = getNumComponents(this,(pvVar19->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar21]);
          uVar10 = uVar15;
          if (uVar9 <= uVar8) break;
          uVar10 = getNumComponents(this,(pvVar19->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar21]);
          if (1 < uVar10) {
            IVar4 = createCompositeExtract
                              (this,(local_d0->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start[uVar21],local_dc,uVar8
                              );
            local_c0 = CONCAT44(local_c0._4_4_,IVar4);
            setPrecision(this,IVar4,local_d4);
          }
          uVar9 = (int)uVar16 + 1;
          *(undefined4 *)
           ((long)&local_78[0]._M_impl.super__Vector_impl_data._M_start +
           uVar16 * 4 + (ulong)uVar15 * 0x10) = (undefined4)local_c0;
          uVar10 = uVar9;
          if (uVar9 == local_e0) {
            uVar10 = 0;
          }
          uVar16 = (ulong)uVar10;
          uVar15 = uVar15 + (uVar9 == local_e0);
          uVar8 = uVar8 + 1;
          pvVar19 = local_d0;
          uVar10 = uVar5;
        } while (uVar15 != uVar5);
        uVar15 = uVar10;
        uVar6 = uVar6 + 1;
        pIVar13 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      }
    }
  }
  local_dc = getContainedTypeId(this,local_d8);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = (ulong)local_e0;
  ppuVar12 = (pointer *)local_78;
  DVar20 = local_d4;
  for (uVar16 = 0; uVar16 != local_80; uVar16 = uVar16 + 1) {
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = ppuVar12;
    uVar21 = local_c0;
    while (bVar3 = uVar21 != 0, uVar21 = uVar21 - 1, bVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
                 (value_type_conflict1 *)__x);
      __x = (pointer *)((long)__x + 4);
    }
    local_e4 = createCompositeConstruct
                         (this,local_dc,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98);
    DVar20 = local_d4;
    setPrecision(this,local_e4,local_d4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,&local_e4);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
    ppuVar12 = ppuVar12 + 2;
  }
  this_00 = &local_b8;
  IVar4 = createCompositeConstruct
                    (this,local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  IVar4 = setPrecision(this,IVar4,DVar20);
LAB_003d942e:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_00);
  return IVar4;
}

Assistant:

Id Builder::createMatrixConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id componentTypeId = getScalarTypeId(resultTypeId);
    unsigned int numCols = getTypeNumColumns(resultTypeId);
    unsigned int numRows = getTypeNumRows(resultTypeId);

    Instruction* instr = module.getInstruction(componentTypeId);
    const unsigned bitCount = instr->getImmediateOperand(0);

    // Optimize matrix constructed from a bigger matrix
    if (isMatrix(sources[0]) && getNumColumns(sources[0]) >= numCols && getNumRows(sources[0]) >= numRows) {
        // To truncate the matrix to a smaller number of rows/columns, we need to:
        // 1. For each column, extract the column and truncate it to the required size using shuffle
        // 2. Assemble the resulting matrix from all columns
        Id matrix = sources[0];
        Id columnTypeId = getContainedTypeId(resultTypeId);
        Id sourceColumnTypeId = getContainedTypeId(getTypeId(matrix));

        std::vector<unsigned> channels;
        for (unsigned int row = 0; row < numRows; ++row)
            channels.push_back(row);

        std::vector<Id> matrixColumns;
        for (unsigned int col = 0; col < numCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            Id colv = createCompositeExtract(matrix, sourceColumnTypeId, indexes);
            setPrecision(colv, precision);

            if (numRows != getNumRows(matrix)) {
                matrixColumns.push_back(createRvalueSwizzle(precision, columnTypeId, colv, channels));
            } else {
                matrixColumns.push_back(colv);
            }
        }

        return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
    }

    // Detect a matrix being constructed from a repeated vector of the correct size.
    // Create the composite directly from it.
    if (sources.size() == numCols && isVector(sources[0]) && getNumComponents(sources[0]) == numRows &&
        std::equal(sources.begin() + 1, sources.end(), sources.begin())) {
        return setPrecision(createCompositeConstruct(resultTypeId, sources), precision);
    }

    // Otherwise, will use a two step process
    // 1. make a compile-time 2D array of values
    // 2. construct a matrix from that array

    // Step 1.

    // initialize the array to the identity matrix
    Id ids[maxMatrixSize][maxMatrixSize];
    Id  one = (bitCount == 64 ? makeDoubleConstant(1.0) : makeFloatConstant(1.0));
    Id zero = (bitCount == 64 ? makeDoubleConstant(0.0) : makeFloatConstant(0.0));
    for (int col = 0; col < 4; ++col) {
        for (int row = 0; row < 4; ++row) {
            if (col == row)
                ids[col][row] = one;
            else
                ids[col][row] = zero;
        }
    }

    // modify components as dictated by the arguments
    if (sources.size() == 1 && isScalar(sources[0])) {
        // a single scalar; resets the diagonals
        for (int col = 0; col < 4; ++col)
            ids[col][col] = sources[0];
    } else if (isMatrix(sources[0])) {
        // constructing from another matrix; copy over the parts that exist in both the argument and constructee
        Id matrix = sources[0];
        unsigned int minCols = std::min(numCols, getNumColumns(matrix));
        unsigned int minRows = std::min(numRows, getNumRows(matrix));
        for (unsigned int col = 0; col < minCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            for (unsigned int row = 0; row < minRows; ++row) {
                indexes.push_back(row);
                ids[col][row] = createCompositeExtract(matrix, componentTypeId, indexes);
                indexes.pop_back();
                setPrecision(ids[col][row], precision);
            }
        }
    } else {
        // fill in the matrix in column-major order with whatever argument components are available
        unsigned int row = 0;
        unsigned int col = 0;

        for (unsigned int arg = 0; arg < sources.size() && col < numCols; ++arg) {
            Id argComp = sources[arg];
            for (unsigned int comp = 0; comp < getNumComponents(sources[arg]); ++comp) {
                if (getNumComponents(sources[arg]) > 1) {
                    argComp = createCompositeExtract(sources[arg], componentTypeId, comp);
                    setPrecision(argComp, precision);
                }
                ids[col][row++] = argComp;
                if (row == numRows) {
                    row = 0;
                    col++;
                }
                if (col == numCols) {
                    // If more components are provided than fit the matrix, discard the rest.
                    break;
                }
            }
        }
    }

    // Step 2:  Construct a matrix from that array.
    // First make the column vectors, then make the matrix.

    // make the column vectors
    Id columnTypeId = getContainedTypeId(resultTypeId);
    std::vector<Id> matrixColumns;
    for (unsigned int col = 0; col < numCols; ++col) {
        std::vector<Id> vectorComponents;
        for (unsigned int row = 0; row < numRows; ++row)
            vectorComponents.push_back(ids[col][row]);
        Id column = createCompositeConstruct(columnTypeId, vectorComponents);
        setPrecision(column, precision);
        matrixColumns.push_back(column);
    }

    // make the matrix
    return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
}